

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

size_t pe_util::forwarderNameLen(char *fPtr,size_t bufSize)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  if (bufSize == 0 || fPtr == (char *)0x0) {
    return 0;
  }
  bVar5 = false;
  sVar3 = 0;
  do {
    bVar1 = fPtr[sVar3];
    bVar2 = true;
    if ((((bVar1 != 0x2e) && (bVar2 = bVar5, 9 < (byte)(bVar1 - 0x30))) &&
        (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
       ((sVar4 = sVar3, 0x3c < bVar1 - 0x23 ||
        ((0x1200000030801c01U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) == 0)))) break;
    bVar5 = bVar2;
    sVar3 = sVar3 + 1;
    sVar4 = bufSize;
  } while (bufSize != sVar3);
  if (!bVar5) {
    sVar4 = 0;
  }
  if (bVar1 != 0) {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

size_t pe_util::forwarderNameLen(const char* fPtr, size_t bufSize)
{
    if (!fPtr || bufSize == 0) return 0;
    
    // names can be also mangled, i.e. MSVCRT.??0__non_rtti_object@std@@QAE@ABV01@@Z
    bool has_dot = false;
    size_t len = 0;
    while ((*fPtr == '.') || _isFuncChar(*fPtr))
    {
        if (*fPtr == '.') has_dot = true;
        len++;
        if ((--bufSize) == 0) break;
        fPtr++;
    }
    if (*fPtr == '\0') {
        if (!has_dot) {
            return 0; //this is not a valid forwarder
        }
        return len;
    }
    return 0;
}